

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp11_zone.hpp
# Opt level: O1

void __thiscall msgpack::v1::zone::chunk_list::chunk_list(chunk_list *this,size_t chunk_size)

{
  chunk *pcVar1;
  undefined8 *puVar2;
  
  pcVar1 = (chunk *)malloc(chunk_size + 8);
  if (pcVar1 != (chunk *)0x0) {
    this->m_head = pcVar1;
    this->m_free = chunk_size;
    this->m_ptr = (char *)(pcVar1 + 1);
    pcVar1->m_next = (chunk *)0x0;
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = __cxa_init_primary_exception;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

chunk_list(size_t chunk_size)
        {
            chunk* c = static_cast<chunk*>(::malloc(sizeof(chunk) + chunk_size));
            if(!c) {
                throw std::bad_alloc();
            }

            m_head = c;
            m_free = chunk_size;
            m_ptr  = reinterpret_cast<char*>(c) + sizeof(chunk);
            c->m_next = MSGPACK_NULLPTR;
        }